

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void read_callback(void *context,cio_epoll_error error)

{
  int __fd;
  cio_read_buffer *read_buffer_00;
  uint8_t *__buf;
  code *pcVar1;
  undefined8 uVar2;
  cio_error cVar3;
  size_t __nbytes;
  ssize_t sVar4;
  int *piVar5;
  ssize_t ret;
  cio_error err;
  cio_socket *socket;
  cio_read_buffer *read_buffer;
  cio_io_stream *stream;
  cio_epoll_error error_local;
  void *context_local;
  
  read_buffer_00 = *(cio_read_buffer **)((long)context + 0x28);
  cVar3 = cio_linux_eventloop_unregister_read
                    (*(cio_eventloop **)((long)context + 200),
                     (cio_event_notifier *)((long)context + 0x68));
  if (cVar3 == CIO_SUCCESS) {
    if (error == CIO_EPOLL_SUCCESS) {
      __fd = *(int *)((long)context + 0x80);
      __buf = read_buffer_00->add_ptr;
      __nbytes = cio_read_buffer_space_available(read_buffer_00);
      sVar4 = read(__fd,__buf,__nbytes);
      if (sVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 0xb) {
          pcVar1 = *(code **)((long)context + 0x18);
          uVar2 = *(undefined8 *)((long)context + 0x20);
          piVar5 = __errno_location();
          (*pcVar1)(context,uVar2,-*piVar5,read_buffer_00);
        }
      }
      else {
        if (sVar4 != 0) {
          read_buffer_00->add_ptr = read_buffer_00->add_ptr + sVar4;
        }
        else {
          *(undefined1 *)((long)context + 0xd0) = 1;
        }
        (**(code **)((long)context + 0x18))
                  (context,*(undefined8 *)((long)context + 0x20),sVar4 == 0,read_buffer_00);
      }
    }
    else {
      cVar3 = cio_linux_get_socket_error(*(int *)((long)context + 0x80));
      (**(code **)((long)context + 0x18))
                (context,*(undefined8 *)((long)context + 0x20),cVar3,read_buffer_00);
    }
  }
  else {
    (**(code **)((long)context + 0x18))
              (context,*(undefined8 *)((long)context + 0x20),cVar3,read_buffer_00);
  }
  return;
}

Assistant:

static void read_callback(void *context, enum cio_epoll_error error)
{
	struct cio_io_stream *stream = context;
	struct cio_read_buffer *read_buffer = stream->read_buffer;
	struct cio_socket *socket = cio_container_of(stream, struct cio_socket, stream);

	enum cio_error err = cio_linux_eventloop_unregister_read(socket->impl.loop, &socket->impl.ev);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
		return;
	}

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		err = cio_linux_get_socket_error(socket->impl.ev.fd);
		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
		return;
	}

	ssize_t ret = read(socket->impl.ev.fd, read_buffer->add_ptr, cio_read_buffer_space_available(read_buffer));
	if (ret == -1) {
		if (cio_unlikely(errno != EAGAIN)) {
			stream->read_handler(stream, stream->read_handler_context, (enum cio_error)(-errno), read_buffer);
		}
	} else {
		if (ret == 0) {
			err = CIO_EOF;
			socket->impl.peer_closed_connection = true;
		} else {
			read_buffer->add_ptr += (size_t)ret;
		}

		stream->read_handler(stream, stream->read_handler_context, err, read_buffer);
	}
}